

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsItem::mapRectToScene(QRectF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *this_00;
  QGraphicsItemPrivate *pQVar1;
  double dVar2;
  double dVar3;
  qreal qVar4;
  long in_FS_OFFSET;
  QGraphicsItem *that;
  QGraphicsItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  local_30 = this_00->q_ptr;
  QGraphicsItemPrivate::ensureSceneTransformRecursive(this_00,&local_30);
  pQVar1 = (this->d_ptr).d;
  if ((this_00->field_0x167 & 0x40) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_005dc63e:
      __stack_chk_fail();
    }
    QTransform::mapRect(__return_storage_ptr__);
  }
  else {
    dVar2 = (pQVar1->sceneTransform).m_matrix[2][1];
    dVar3 = rect->yp;
    __return_storage_ptr__->xp = rect->xp + (pQVar1->sceneTransform).m_matrix[2][0];
    __return_storage_ptr__->yp = dVar3 + dVar2;
    qVar4 = rect->h;
    __return_storage_ptr__->w = rect->w;
    __return_storage_ptr__->h = qVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_005dc63e;
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsItem::mapRectToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.mapRect(rect);
}